

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readokt.c
# Opt level: O3

int it_okt_read_pattern(IT_PATTERN *pattern,uchar *data,int length,int n_channels)

{
  ushort uVar1;
  uint uVar2;
  IT_ENTRY *pIVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  byte bVar10;
  byte bVar11;
  int iVar12;
  
  iVar4 = -1;
  if (1 < length) {
    uVar1 = *(ushort *)data << 8 | *(ushort *)data >> 8;
    uVar2 = 0x40;
    if (uVar1 != 0) {
      uVar2 = (uint)uVar1;
    }
    if ((int)(n_channels * uVar2 * 4 + 2) <= length) {
      pattern->n_rows = uVar2;
      pattern->n_entries = uVar2;
      iVar12 = uVar2 + (uVar2 == 0);
      iVar5 = 2;
      iVar6 = 0;
      do {
        if (0 < n_channels) {
          lVar7 = (long)iVar5;
          lVar8 = 0;
          do {
            if (data[lVar8 * 4 + lVar7 + 2] != '\0' || data[lVar8 * 4 + lVar7] != '\0') {
              uVar2 = uVar2 + 1;
              pattern->n_entries = uVar2;
            }
            lVar8 = lVar8 + 1;
            iVar5 = iVar5 + 4;
          } while (n_channels != (int)lVar8);
        }
        iVar6 = iVar6 + 1;
      } while (iVar6 != iVar12);
      pIVar3 = (IT_ENTRY *)malloc((long)(int)uVar2 * 7);
      pattern->entry = pIVar3;
      if (pIVar3 != (IT_ENTRY *)0x0) {
        iVar4 = 2;
        iVar5 = 0;
        do {
          if (0 < n_channels) {
            lVar8 = (long)iVar4;
            lVar7 = lVar8 + 3;
            lVar9 = 0;
            do {
              if (data[lVar9 * 4 + lVar8 + 2] == '\0' && data[lVar9 * 4 + lVar8] == '\0')
              goto LAB_0070febd;
              pIVar3->channel = (uchar)lVar9;
              pIVar3->mask = '\0';
              if ((byte)(data[lVar9 * 4 + lVar8] - 1) < 0x24) {
                pIVar3->mask = '\x03';
                pIVar3->note = data[lVar9 * 4 + lVar8] + '#';
                pIVar3->instrument = data[lVar9 * 4 + lVar8 + 1] + '\x01';
                bVar10 = 3;
              }
              else {
                bVar10 = 0;
              }
              pIVar3->effect = '\0';
              bVar11 = data[lVar9 * 4 + lVar7];
              pIVar3->effectvalue = bVar11;
              switch(data[lVar9 * 4 + lVar8 + 2]) {
              case '\x01':
                if (bVar11 != 0) {
                  pIVar3->effect = '\x06';
                  goto LAB_0070feaf;
                }
                break;
              case '\x02':
                if (bVar11 != 0) {
                  pIVar3->effect = '\x05';
                  goto LAB_0070feaf;
                }
                break;
              case '\n':
                if (bVar11 != 0) {
                  pIVar3->effect = '*';
                  goto LAB_0070feaf;
                }
                break;
              case '\v':
                if (bVar11 != 0) {
                  pIVar3->effect = '+';
                  goto LAB_0070feaf;
                }
                break;
              case '\f':
                if (bVar11 != 0) {
                  pIVar3->effect = ',';
                  goto LAB_0070feaf;
                }
                break;
              case '\r':
                if (bVar11 != 0) {
                  pIVar3->effect = '&';
                  goto LAB_0070feaf;
                }
                break;
              case '\x0f':
                pIVar3->effect = '\x13';
                bVar11 = data[lVar9 * 4 + lVar7] & 0xf;
LAB_0070feab:
                pIVar3->effectvalue = bVar11;
                goto LAB_0070feaf;
              case '\x11':
                if (bVar11 != 0) {
                  pIVar3->effect = '(';
                  goto LAB_0070feaf;
                }
                break;
              case '\x15':
                if (bVar11 != 0) {
                  pIVar3->effect = '\'';
                  goto LAB_0070feaf;
                }
                break;
              case '\x19':
                pIVar3->effect = '\x02';
                goto LAB_0070feaf;
              case '\x1b':
                pIVar3->note = 0xff;
                bVar11 = 1;
                goto LAB_0070feb2;
              case '\x1c':
                pIVar3->effect = '\x01';
                goto LAB_0070feaf;
              case '\x1e':
                if (bVar11 != 0) {
                  pIVar3->effect = ')';
                  goto LAB_0070feaf;
                }
                break;
              case '\x1f':
                if (0x40 < bVar11) {
                  if (bVar11 < 0x51) {
                    pIVar3->effect = '-';
                    bVar11 = data[lVar9 * 4 + lVar7] - 0x40;
                  }
                  else {
                    if (bVar11 < 0x61) {
                      pIVar3->effect = '.';
                    }
                    else {
                      if (0x70 < bVar11) {
                        if (0x80 < bVar11) break;
                        pIVar3->effect = '.';
                        bVar11 = data[lVar9 * 4 + lVar7] + 0xa0;
                        goto LAB_0070feab;
                      }
                      pIVar3->effect = '-';
                    }
                    bVar11 = data[lVar9 * 4 + lVar7] + 0xb0;
                  }
                  goto LAB_0070feab;
                }
                pIVar3->effect = '\r';
LAB_0070feaf:
                bVar11 = 8;
LAB_0070feb2:
                pIVar3->mask = bVar10 | bVar11;
              }
              pIVar3 = pIVar3 + 1;
LAB_0070febd:
              lVar9 = lVar9 + 1;
              iVar4 = iVar4 + 4;
            } while (n_channels != (int)lVar9);
          }
          pIVar3->channel = 0xff;
          pIVar3 = pIVar3 + 1;
          iVar5 = iVar5 + 1;
        } while (iVar5 != iVar12);
        iVar4 = 0;
      }
    }
  }
  return iVar4;
}

Assistant:

static int it_okt_read_pattern(IT_PATTERN *pattern, const unsigned char *data, int length, int n_channels)
{
	int pos;
	int channel;
	int row;
	int n_rows;
	IT_ENTRY *entry;

	if (length < 2) return -1;

	n_rows = (data[0] << 8) | data[1];
	if (!n_rows) n_rows = 64;

	if (length < 2 + (n_rows * n_channels * 4)) return -1;

	pattern->n_rows = n_rows;

	/* compute number of entries */
	pattern->n_entries = n_rows; /* Account for the row end markers */
	pos = 2;
	for (row = 0; row < pattern->n_rows; row++) {
		for (channel = 0; channel < n_channels; channel++) {
			if (data[pos+0] | data[pos+2])
				pattern->n_entries++;
			pos += 4;
		}
	}

	pattern->entry = (IT_ENTRY *) malloc(pattern->n_entries * sizeof(*pattern->entry));
	if (!pattern->entry)
		return -1;

	entry = pattern->entry;
	pos = 2;
	for (row = 0; row < n_rows; row++) {
		for (channel = 0; channel < n_channels; channel++) {
			if (data[pos+0] | data[pos+2]) {
				entry->channel = channel;
				entry->mask = 0;

				if (data[pos+0] > 0 && data[pos+0] <= 36) {
					entry->mask |= IT_ENTRY_NOTE | IT_ENTRY_INSTRUMENT;

					entry->note = data[pos+0] + 35;
					entry->instrument = data[pos+1] + 1;
				}

				entry->effect = 0;
				entry->effectvalue = data[pos+3];

				switch (data[pos+2]) {
				case  2: if (data[pos+3]) entry->effect = IT_PORTAMENTO_DOWN; break; // XXX code calls this rs_portu, but it's adding to the period, which decreases the pitch
				case 13: if (data[pos+3]) entry->effect = IT_OKT_NOTE_SLIDE_DOWN; break;
				case 21: if (data[pos+3]) entry->effect = IT_OKT_NOTE_SLIDE_DOWN_ROW; break;

				case  1: if (data[pos+3]) entry->effect = IT_PORTAMENTO_UP; break;   // XXX same deal here, increasing the pitch
				case 17: if (data[pos+3]) entry->effect = IT_OKT_NOTE_SLIDE_UP; break;
				case 30: if (data[pos+3]) entry->effect = IT_OKT_NOTE_SLIDE_UP_ROW; break;

				case 10: if (data[pos+3]) entry->effect = IT_OKT_ARPEGGIO_3; break;
				case 11: if (data[pos+3]) entry->effect = IT_OKT_ARPEGGIO_4; break;
				case 12: if (data[pos+3]) entry->effect = IT_OKT_ARPEGGIO_5; break;

				case 15: entry->effect = IT_S; entry->effectvalue = EFFECT_VALUE(IT_S_SET_FILTER, data[pos+3] & 0x0F); break;

				case 25: entry->effect = IT_JUMP_TO_ORDER; break;

				case 27: entry->note = IT_NOTE_OFF; entry->mask |= IT_ENTRY_NOTE; break;

				case 28: entry->effect = IT_SET_SPEED; break;

				case 31:
					if ( data[pos+3] <= 0x40 ) entry->effect = IT_SET_CHANNEL_VOLUME;
					else if ( data[pos+3] <= 0x50 ) { entry->effect = IT_OKT_VOLUME_SLIDE_DOWN; entry->effectvalue = data[pos+3] - 0x40; }
					else if ( data[pos+3] <= 0x60 ) { entry->effect = IT_OKT_VOLUME_SLIDE_UP;   entry->effectvalue = data[pos+3] - 0x50; }
					else if ( data[pos+3] <= 0x70 ) { entry->effect = IT_OKT_VOLUME_SLIDE_DOWN; entry->effectvalue = data[pos+3] - 0x50; }
					else if ( data[pos+3] <= 0x80 ) { entry->effect = IT_OKT_VOLUME_SLIDE_UP;   entry->effectvalue = data[pos+3] - 0x60; }
					break;
				}

				if ( entry->effect ) entry->mask |= IT_ENTRY_EFFECT;

				entry++;
			}
			pos += 4;
		}
		IT_SET_END_ROW(entry);
		entry++;
	}

	return 0;
}